

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

Expression * __thiscall
soul::StructuralParser::parseSuffixes(StructuralParser *this,Expression *expression)

{
  UnqualifiedName *pUVar1;
  bool bVar2;
  pool_ref<soul::AST::Expression> *insertPos;
  DotOperator *pDVar3;
  QualifiedIdentifier *args_00;
  CallOrCast *pCVar4;
  pool_ref<soul::AST::Expression> *this_00;
  bool local_d2;
  bool local_d1;
  string *local_d0;
  IdentifierPath local_c8;
  QualifiedIdentifier *local_70;
  QualifiedIdentifier *fn;
  pool_ptr<soul::AST::DotOperator> dot;
  CommaSeparatedList *args;
  undefined1 local_38 [8];
  Context context;
  Expression *expression_local;
  StructuralParser *this_local;
  
  context.parentScope = (Scope *)expression;
  getContext((Context *)local_38,this);
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x4d44a1);
  if (bVar2) {
    this_local = (StructuralParser *)parseDotOperator(this,(Expression *)context.parentScope);
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d4496);
    if (bVar2) {
      dot.object = (DotOperator *)parseCommaSeparatedListOfExpressions(this,false,false);
      cast<soul::AST::DotOperator,soul::AST::Expression>
                ((soul *)&fn,(Expression *)context.parentScope);
      bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&fn);
      if (bVar2) {
        this_00 = &(dot.object)->lhs;
        insertPos = ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::begin
                              ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *
                               )this_00);
        pDVar3 = pool_ptr<soul::AST::DotOperator>::operator->
                           ((pool_ptr<soul::AST::DotOperator> *)&fn);
        ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL>::insert
                  ((ArrayWithPreallocation<soul::pool_ref<soul::AST::Expression>,_4UL> *)this_00,
                   insertPos,&pDVar3->lhs);
        pDVar3 = pool_ptr<soul::AST::DotOperator>::operator->
                           ((pool_ptr<soul::AST::DotOperator> *)&fn);
        pUVar1 = pDVar3->rhs;
        pDVar3 = pool_ptr<soul::AST::DotOperator>::operator->
                           ((pool_ptr<soul::AST::DotOperator> *)&fn);
        local_d0 = (pDVar3->rhs->identifier).name;
        IdentifierPath::IdentifierPath(&local_c8,(Identifier)local_d0);
        args_00 = allocate<soul::AST::QualifiedIdentifier,soul::AST::Context&,soul::IdentifierPath>
                            (this,&(pUVar1->super_Expression).super_Statement.super_ASTObject.
                                   context,&local_c8);
        IdentifierPath::~IdentifierPath(&local_c8);
        local_d1 = true;
        local_70 = args_00;
        pCVar4 = allocate<soul::AST::CallOrCast,soul::AST::QualifiedIdentifier&,soul::AST::CommaSeparatedList&,bool>
                           (this,args_00,(CommaSeparatedList *)dot.object,&local_d1);
        this_local = (StructuralParser *)parseSuffixes(this,(Expression *)pCVar4);
      }
      pool_ptr<soul::AST::DotOperator>::~pool_ptr((pool_ptr<soul::AST::DotOperator> *)&fn);
      if (!bVar2) {
        local_d2 = false;
        pCVar4 = allocate<soul::AST::CallOrCast,soul::AST::Expression&,soul::AST::CommaSeparatedList&,bool>
                           (this,(Expression *)context.parentScope,(CommaSeparatedList *)dot.object,
                            &local_d2);
        this_local = (StructuralParser *)parseSuffixes(this,(Expression *)pCVar4);
      }
    }
    else {
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4d443d);
      if (bVar2) {
        this_local = (StructuralParser *)
                     parseSubscriptWithBrackets(this,(Expression *)context.parentScope);
      }
      else {
        bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x4ad381);
        if (bVar2) {
          this_local = (StructuralParser *)
                       parsePostIncDec(this,(Expression *)context.parentScope,true);
        }
        else {
          bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                  ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)"--");
          if (bVar2) {
            this_local = (StructuralParser *)
                         parsePostIncDec(this,(Expression *)context.parentScope,false);
          }
          else {
            this_local = (StructuralParser *)context.parentScope;
          }
        }
      }
    }
  }
  AST::Context::~Context((Context *)local_38);
  return (Expression *)this_local;
}

Assistant:

AST::Expression& parseSuffixes (AST::Expression& expression)
    {
        auto context = getContext();

        if (matches (Operator::dot))
            return parseDotOperator (expression);

        if (matchIf (Operator::openParen))
        {
            auto& args = parseCommaSeparatedListOfExpressions (false, false);

            if (auto dot = cast<AST::DotOperator> (expression))
            {
                args.items.insert (args.items.begin(), dot->lhs);
                auto& fn = allocate<AST::QualifiedIdentifier> (dot->rhs.context, IdentifierPath (dot->rhs.identifier));
                return parseSuffixes (allocate<AST::CallOrCast> (fn, args, true));
            }

            return parseSuffixes (allocate<AST::CallOrCast> (expression, args, false));
        }

        if (matchIf (Operator::openBracket))  return parseSubscriptWithBrackets (expression);
        if (matchIf (Operator::plusplus))     return parsePostIncDec (expression, true);
        if (matchIf (Operator::minusminus))   return parsePostIncDec (expression, false);

        return expression;
    }